

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O0

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *rdbuf)

{
  int iVar1;
  uv_buf_t uVar2;
  char *local_50;
  char *local_48;
  undefined1 auStack_38 [4];
  int r;
  uv_buf_t wrbuf;
  uv_write_t *req;
  uv_buf_t *rdbuf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if ((nread < 1) && (nread != -0xfff)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x66,"nread > 0 || nread == UV_EOF");
    abort();
  }
  if ((0 < nread) && (output_used = output_used + (int)nread, output_used == 0xc)) {
    iVar1 = memcmp("hello world\n",output,0xc);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
              ,0x6b,"memcmp(\"hello world\\n\", output, 12) == 0");
      abort();
    }
    uVar2 = uv_buf_init(output,output_used);
    local_50 = uVar2.base;
    _auStack_38 = local_50;
    local_48 = (char *)uVar2.len;
    wrbuf.base = local_48;
    wrbuf.len = (size_t)malloc(0xc0);
    iVar1 = uv_write((uv_write_t *)wrbuf.len,(uv_stream_t *)&in,(uv_buf_t *)auStack_38,1,after_write
                    );
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
              ,0x6f,"r == 0");
      abort();
    }
  }
  on_read_cb_called = on_read_cb_called + 1;
  return;
}

Assistant:

static void on_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* rdbuf) {
  uv_write_t* req;
  uv_buf_t wrbuf;
  int r;

  ASSERT(nread > 0 || nread == UV_EOF);

  if (nread > 0) {
    output_used += nread;
    if (output_used == 12) {
      ASSERT(memcmp("hello world\n", output, 12) == 0);
      wrbuf = uv_buf_init(output, output_used);
      req = malloc(sizeof(*req));
      r = uv_write(req, (uv_stream_t*)&in, &wrbuf, 1, after_write);
      ASSERT(r == 0);
    }
  }

  on_read_cb_called++;
}